

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O1

lyd_node *
resolve_partial_json_data_nodeid
          (char *nodeid,char *llist_value,lyd_node *start,int options,int *parsed)

{
  char cVar1;
  byte bVar2;
  ly_ctx *ctx;
  parsed_pred pp_00;
  uint uVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  lys_module *plVar6;
  long lVar7;
  lys_node *node;
  lys_node *plVar8;
  void *pvVar9;
  size_t sVar10;
  char *pcVar11;
  lys_node *plVar12;
  ushort **ppuVar13;
  lys_module *plVar14;
  char *pcVar15;
  lyd_node *node_00;
  undefined4 extraout_var_00;
  LY_ERR no;
  LY_VLOG_ELEM elem_type;
  anon_struct_48_6_89480d8a *paVar16;
  LY_ECODE ecode;
  ulong uVar17;
  char *pcVar18;
  lyd_node *plVar19;
  long lVar20;
  hash_table *phVar21;
  lyd_node *plVar22;
  char *id;
  char *local_b8;
  char *mod_name;
  char *name;
  ly_ctx *local_a0;
  uint local_94;
  int local_90;
  int local_8c;
  int mod_name_len;
  int nam_len;
  int local_7c;
  lys_node *plStack_78;
  int has_predicate;
  parsed_pred pp;
  int local_54;
  ly_ctx *plStack_50;
  int is_relative;
  lyd_node *local_48;
  char *local_40;
  int *local_38;
  
  local_54 = -1;
  local_94 = options;
  if (((nodeid == (char *)0x0) || (start == (lyd_node *)0x0)) || (parsed == (int *)0x0)) {
    __assert_fail("nodeid && start && parsed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0xa43,
                  "struct lyd_node *resolve_partial_json_data_nodeid(const char *, const char *, struct lyd_node *, int, int *)"
                 );
  }
  plStack_78 = (lys_node *)0x0;
  pp.schema = (lys_node *)0x0;
  pp.len = 0;
  pp._12_4_ = 0;
  ctx = start->schema->module->ctx;
  uVar3 = parse_schema_nodeid(nodeid,&local_b8,&local_90,&mod_name,&local_8c,&local_54,(int *)0x0,
                              (int *)0x0,1);
  if ((int)uVar3 < 1) {
    mod_name = nodeid + -uVar3;
    cVar1 = nodeid[-uVar3];
LAB_00114625:
    uVar17 = (ulong)(uint)(int)cVar1;
  }
  else {
    if (*mod_name != '#') {
      local_54 = -1;
      name = (char *)0x0;
LAB_0011458d:
      local_40 = llist_value;
      uVar3 = parse_schema_nodeid(nodeid,&local_b8,&local_90,&mod_name,&local_8c,&local_54,&local_7c
                                  ,(int *)0x0,0);
      if (0 < (int)uVar3) {
        plStack_50 = ctx;
        local_38 = parsed;
        if (local_54 == 0) {
          do {
            plVar19 = start;
            start = plVar19->parent;
          } while (plVar19->parent != (lyd_node *)0x0);
          plVar6 = lyd_node_module(plVar19);
        }
        else {
          plVar6 = lyd_node_module(start);
          if ((start->schema->nodetype & (LYS_ACTION|LYS_RPC|LYS_NOTIF|LYS_LIST|LYS_CONTAINER)) ==
              LYS_UNKNOWN) {
            plVar19 = (lyd_node *)0x0;
          }
          else {
            plVar19 = start->child;
          }
        }
        if (plVar19 == (lyd_node *)0x0) {
          return (lyd_node *)0x0;
        }
        id = nodeid + uVar3;
        pcVar11 = (char *)(ulong)((int)name + uVar3);
        pcVar18 = "";
        if (local_40 != (char *)0x0) {
          pcVar18 = local_40;
        }
        local_48 = (lyd_node *)0x0;
LAB_001146a2:
        free((void *)pp._8_8_);
        plStack_78 = (lys_node *)0x0;
        pp.schema = (lys_node *)((ulong)pp.schema & 0xffffffff00000000);
        pp.len = 0;
        pp._12_4_ = 0;
        if (local_7c != 0) {
          do {
            lVar7 = (long)(int)pp.schema;
            pp.schema = (lys_node *)CONCAT44(pp.schema._4_4_,(int)(lVar7 + 1));
            pp._8_8_ = ly_realloc((void *)pp._8_8_,(lVar7 + 1) * 0x30);
            if ((void *)pp._8_8_ == (void *)0x0) {
              ly_log(plStack_50,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                     "resolve_partial_json_data_nodeid");
              parsed = local_38;
              goto LAB_00114638;
            }
            lVar7 = (long)(int)pp.schema * 0x30;
            uVar3 = parse_schema_json_predicate
                              (id,(char **)(pp._8_8_ + lVar7 + -0x30),
                               (int *)(pp._8_8_ + lVar7 + -0x28),(char **)(pp._8_8_ + lVar7 + -0x20)
                               ,(int *)(pp._8_8_ + lVar7 + -0x18),
                               (char **)(pp._8_8_ + lVar7 + -0x10),(int *)(pp._8_8_ + lVar7 + -8),
                               &local_7c);
            if ((int)uVar3 < 1) {
              uVar3 = (uint)*id;
              pcVar11 = id;
              goto LAB_00114ea3;
            }
            id = id + uVar3;
            pcVar11 = (char *)(ulong)((int)pcVar11 + uVar3);
          } while (local_7c != 0);
        }
        if (plVar19->parent == (lyd_node *)0x0) {
          plVar12 = (lys_node *)0x0;
        }
        else {
          plVar12 = plVar19->parent->schema;
        }
        name = pcVar11;
        node = lys_getnext((lys_node *)0x0,plVar12,plVar6,0);
        plVar22 = local_48;
        if (node != (lys_node *)0x0) {
          do {
            if ((plVar12 == (lys_node *)0x0) ||
               ((plVar12->nodetype & (LYS_ACTION|LYS_RPC)) == LYS_UNKNOWN)) {
LAB_001147a2:
              iVar4 = schema_nodeid_siblingcheck(node,plVar6,local_b8,local_90,mod_name,local_8c);
              parsed = local_38;
              if (iVar4 == 0) goto LAB_001147e9;
            }
            else {
              plVar8 = lys_parent(node);
              if ((local_94 & 4) == 0) {
                if (plVar8->nodetype != LYS_OUTPUT) goto LAB_001147a2;
              }
              else if (plVar8->nodetype != LYS_INPUT) goto LAB_001147a2;
            }
            node = lys_getnext(node,plVar12,plVar6,0);
            plVar22 = local_48;
            if (node == (lys_node *)0x0) break;
          } while( true );
        }
        goto LAB_00114643;
      }
      mod_name = nodeid + -uVar3;
      cVar1 = nodeid[-uVar3];
      goto LAB_00114625;
    }
    if (local_54 == 0) {
      nodeid = nodeid + uVar3;
      name = (char *)CONCAT44(extraout_var,uVar3);
      goto LAB_0011458d;
    }
    uVar17 = 0x23;
  }
  ly_vlog(ctx,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,uVar17,mod_name);
LAB_00114638:
  *parsed = -1;
  plVar22 = (lyd_node *)0x0;
LAB_00114643:
  free((void *)pp._8_8_);
  return plVar22;
LAB_001147e9:
  plStack_78 = node;
  if (((*id == '\0') && ((int)pp.schema == 0)) && (node->nodetype == LYS_LEAFLIST)) {
    pp.schema = (lys_node *)CONCAT44(pp.schema._4_4_,1);
    pvVar9 = calloc(1,0x30);
    pp._8_8_ = pvVar9;
    if (pvVar9 == (void *)0x0) {
      pcVar11 = "Memory allocation failed (%s()).";
      pcVar18 = "resolve_partial_json_data_nodeid";
      no = LY_EMEM;
LAB_00114eec:
      ly_log(plStack_50,LY_LLERR,no,pcVar11,pcVar18);
      goto LAB_00114638;
    }
    *(char **)((long)pvVar9 + 0x10) = ".";
    *(undefined4 *)((long)pvVar9 + 0x18) = 1;
    *(char **)((long)pvVar9 + 0x20) = pcVar18;
    sVar10 = strlen(pcVar18);
    *(int *)((long)pvVar9 + 0x28) = (int)sVar10;
  }
  iVar4 = (int)pp.schema;
  if ((node->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
    if (node->nodetype == LYS_LIST) {
      lVar7 = (long)(int)pp.schema;
      if (lVar7 == 0) {
        return local_48;
      }
      ppuVar13 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar13 + (long)**(char **)(pp._8_8_ + 0x10) * 2 + 1) & 8) == 0) {
        if ((int)(uint)node->padding[2] < iVar4) goto LAB_00114f5e;
        if (iVar4 < (int)(uint)node->padding[2]) {
          ly_vlog(plStack_50,LYE_PATH_MISSKEY,LY_VLOG_NONE,(void *)0x0,
                  **(undefined8 **)(*(long *)&node[1].flags + lVar7 * 8));
          parsed = local_38;
          goto LAB_00114638;
        }
        if (0 < (int)pp.schema) {
          lVar20 = 5;
          lVar7 = 0;
          do {
            if ((*(int *)(*(long *)(*(long *)&node[1].flags + lVar7 * 8) + 0x80) == 7) &&
               (pcVar11 = strnchr(*(char **)(pp._8_8_ + -8 + lVar20 * 8),0x3a,
                                  *(uint *)(pp._8_8_ + lVar20 * 8)), pcVar11 == (char *)0x0)) {
              node = *(lys_node **)(*(long *)&node[1].flags + lVar7 * 8);
              uVar17 = (ulong)*(uint *)(pp._8_8_ + lVar20 * 8);
              pcVar11 = *(char **)(pp._8_8_ + -8 + lVar20 * 8);
              ecode = LYE_PATH_INIDENTREF;
              elem_type = LY_VLOG_LYS;
              goto LAB_00114eb3;
            }
            lVar7 = lVar7 + 1;
            lVar20 = lVar20 + 6;
          } while (lVar7 < (int)pp.schema);
        }
      }
    }
    else if (pp._8_8_ != 0) {
LAB_00114f5e:
      ly_vlog(plStack_50,LYE_PATH_PREDTOOMANY,LY_VLOG_NONE,(void *)0x0);
      parsed = local_38;
      goto LAB_00114638;
    }
  }
  else {
    if (1 < (int)pp.schema) {
      ly_vlog(plStack_50,LYE_PATH_PREDTOOMANY,LY_VLOG_NONE,(void *)0x0);
      goto LAB_00114638;
    }
    if ((int)pp.schema != 0) {
      pcVar11 = *(char **)(pp._8_8_ + 0x10);
      uVar17 = (ulong)(uint)(int)*pcVar11;
      if (((int)*pcVar11 != 0x2e) || (*(int *)(pp._8_8_ + 0x18) != 1)) goto LAB_00114f24;
      if ((*(int *)&node[1].ref == 7) &&
         (pcVar11 = strnchr(*(char **)(pp._8_8_ + 0x20),0x3a,*(uint *)(pp._8_8_ + 0x28)),
         pcVar11 == (char *)0x0)) {
        uVar17 = (ulong)*(uint *)(pp._8_8_ + 0x28);
        pcVar11 = *(char **)(pp._8_8_ + 0x20);
        ecode = LYE_PATH_INIDENTREF;
        elem_type = LY_VLOG_LYS;
        goto LAB_00114eb3;
      }
    }
  }
  plVar22 = plVar19->parent;
  if ((plVar22 == (lyd_node *)0x0) || (plVar22->ht == (hash_table *)0x0)) {
LAB_0011499c:
    iVar4 = 0;
    parsed = local_38;
    node_00 = plVar19;
    plVar22 = local_48;
    do {
      local_40 = (char *)CONCAT44(local_40._4_4_,iVar4);
      plVar12 = lys_parent(node_00->schema);
      if (plVar12 != (lys_node *)0x0) {
        plVar12 = lys_parent(node_00->schema);
        if ((local_94 & 4) == 0) {
          if (plVar12->nodetype == LYS_OUTPUT) {
            pcVar18 = node_00->schema->name;
            pcVar11 = "Provided data tree includes some RPC output nodes (%s).";
LAB_00114ee1:
            no = LY_EINVAL;
            goto LAB_00114eec;
          }
        }
        else if (plVar12->nodetype == LYS_INPUT) {
          pcVar18 = node_00->schema->name;
          pcVar11 = "Provided data tree includes some RPC input nodes (%s).";
          goto LAB_00114ee1;
        }
      }
      plVar12 = node_00->schema;
      if (plVar12 == node) {
        if (node->nodetype == LYS_LIST) {
          if (plVar12->nodetype != LYS_LIST) {
            __assert_fail("node->schema->nodetype == LYS_LIST",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                          ,0x9e5,
                          "int resolve_partial_json_data_list_predicate(struct parsed_pred, struct lyd_node *, int)"
                         );
          }
          if ((int)pp.schema == 0) {
            __assert_fail("pp.len",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                          ,0x9e6,
                          "int resolve_partial_json_data_list_predicate(struct parsed_pred, struct lyd_node *, int)"
                         );
          }
          local_40 = (char *)CONCAT44(local_40._4_4_,(int)local_40 + 1);
          pp.pred = (anon_struct_48_6_89480d8a *)pp._8_8_;
          local_a0 = plVar12->module->ctx;
          ppuVar13 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar13 + (long)*(pp.pred)->name * 2 + 1) & 8) == 0) {
            plVar19 = node_00->child;
            uVar3 = 1;
            if (plVar19 != (lyd_node *)0x0) {
              if (plVar12->padding[2] != '\0') {
                uVar17 = 0;
                paVar16 = pp.pred;
                do {
                  pcVar11 = plVar19->schema->name;
                  iVar4 = paVar16->nam_len;
                  _mod_name_len = plVar19;
                  pp.pred = paVar16;
                  iVar5 = strncmp(pcVar11,paVar16->name,(long)iVar4);
                  paVar16 = pp.pred;
                  if ((iVar5 != 0) || (pcVar11[iVar4] != '\0')) {
                    ly_vlog(local_a0,LYE_PATH_INKEY,LY_VLOG_NONE,(void *)0x0,(pp.pred)->name);
                    uVar3 = 0xffffffff;
                    goto LAB_00114d36;
                  }
                  pcVar11 = (pp.pred)->mod_name;
                  plVar6 = lyd_node_module(_mod_name_len);
                  if (pcVar11 != (char *)0x0) {
                    iVar4 = strncmp(plVar6->name,paVar16->mod_name,(long)paVar16->mod_name_len);
                    plVar19 = _mod_name_len;
                    if ((iVar4 == 0) &&
                       (plVar6 = lyd_node_module(_mod_name_len),
                       plVar6->name[paVar16->mod_name_len] == '\0')) {
                      plVar6 = lyd_node_module(plVar19);
                      plVar14 = lyd_node_module(node_00);
                      if (plVar6 == plVar14) goto LAB_00114d49;
                      goto LAB_00114b6e;
                    }
                    pcVar11 = paVar16->name;
LAB_00114d51:
                    ly_vlog(local_a0,LYE_PATH_INKEY,LY_VLOG_NONE,(void *)0x0,pcVar11);
LAB_00114d68:
                    uVar3 = 0xffffffff;
                    parsed = local_38;
                    plVar22 = local_48;
                    goto LAB_00114d8a;
                  }
                  plVar14 = lyd_node_module(node_00);
                  plVar19 = _mod_name_len;
                  if (plVar6 != plVar14) {
LAB_00114d49:
                    pcVar11 = (pp.pred)->name;
                    goto LAB_00114d51;
                  }
LAB_00114b6e:
                  pcVar11 = lyd_make_canonical(plVar19->schema,(pp.pred)->value,(pp.pred)->val_len);
                  if (pcVar11 == (char *)0x0) goto LAB_00114d68;
                  iVar4 = strcmp((char *)plVar19->ht,pcVar11);
                  _mod_name_len = (lyd_node *)CONCAT44(nam_len,iVar4);
                  free(pcVar11);
                  if (mod_name_len != 0) {
                    uVar3 = 1;
                    parsed = local_38;
                    plVar22 = local_48;
                    goto LAB_00114d8a;
                  }
                  plVar19 = plVar19->next;
                  uVar17 = uVar17 + 1;
                  paVar16 = pp.pred + 1;
                } while (uVar17 < plVar12->padding[2]);
                uVar3 = 0;
LAB_00114d36:
                parsed = local_38;
                plVar22 = local_48;
                goto LAB_00114d8a;
              }
              uVar3 = 0;
            }
          }
          else {
            iVar4 = atoi((pp.pred)->name);
            uVar3 = (uint)(iVar4 != (int)local_40);
          }
LAB_00114d8a:
          iVar4 = (int)local_40;
          if (uVar3 != 1) {
            if (uVar3 != 0xffffffff) goto LAB_00114dc4;
            goto LAB_00114638;
          }
        }
        else {
          if (node->nodetype != LYS_LEAFLIST) goto LAB_00114dc4;
          if ((node->flags & 2) != 0) goto LAB_001149ec;
          if (pp._8_8_ == 0) {
            pcVar11 = (char *)0x0;
            pp.pred = (anon_struct_48_6_89480d8a *)0x0;
          }
          else {
            pcVar11 = *(char **)(pp._8_8_ + 0x20);
            pp.pred = (anon_struct_48_6_89480d8a *)(long)*(int *)(pp._8_8_ + 0x28);
          }
          if (((pcVar11 == (char *)0x0) || (pcVar15 = strchr(pcVar11,0x3a), pcVar15 != (char *)0x0))
             || (((ulong)node_00[1].schema & 7) == 0)) {
LAB_00114c1a:
            phVar21 = node_00->ht;
          }
          else {
            _mod_name_len = (lyd_node *)node_00->ht;
            plVar6 = lyd_node_module(node_00);
            pcVar15 = plVar6->name;
            plVar6 = lyd_node_module(node_00);
            sVar10 = strlen(plVar6->name);
            iVar4 = strncmp((char *)_mod_name_len,pcVar15,sVar10);
            if (iVar4 != 0) goto LAB_00114c1a;
            phVar21 = node_00->ht;
            plVar6 = lyd_node_module(node_00);
            sVar10 = strlen(plVar6->name);
            if (*(char *)((long)&phVar21->used + sVar10) != ':') goto LAB_00114c1a;
            phVar21 = node_00->ht;
            plVar6 = lyd_node_module(node_00);
            sVar10 = strlen(plVar6->name);
            phVar21 = (hash_table *)((long)&phVar21->used + sVar10 + 1);
          }
          paVar16 = pp.pred;
          parsed = local_38;
          plVar22 = local_48;
          if (((pcVar11 != (char *)0x0) || (phVar21 == (hash_table *)0x0)) ||
             (iVar4 = (int)local_40, (char)phVar21->used == '\0')) {
            if (pcVar11 == (char *)0x0) goto LAB_00114dc4;
            iVar4 = strncmp(pcVar11,(char *)phVar21,(size_t)pp.pred);
            parsed = local_38;
            plVar22 = local_48;
            if (iVar4 != 0) goto LAB_001149ec;
            iVar4 = (int)local_40;
            if (*(char *)((long)&paVar16->mod_name + (long)&phVar21->used) == '\0')
            goto LAB_00114dc4;
          }
        }
      }
      else {
LAB_001149ec:
        iVar4 = (int)local_40;
      }
      node_00 = node_00->next;
    } while (node_00 != (lyd_node *)0x0);
    node_00 = (lyd_node *)0x0;
  }
  else {
    if (plStack_78->nodetype == LYS_LEAFLIST) {
      bVar2 = (byte)plStack_78->flags & 1;
joined_r0x00114996:
      if (bVar2 == 0) goto LAB_0011499c;
    }
    else if (plStack_78->nodetype == LYS_LIST) {
      bVar2 = plStack_78->padding[2];
      goto joined_r0x00114996;
    }
    pp_00._8_8_ = pp.schema;
    pp_00.schema = plStack_78;
    pp_00.pred._0_4_ = pp.len;
    pp_00.pred._4_4_ = pp._12_4_;
    node_00 = resolve_json_data_node_hash(plVar22,pp_00);
    parsed = local_38;
    plVar22 = local_48;
  }
LAB_00114dc4:
  if (node_00 == (lyd_node *)0x0) goto LAB_00114643;
  *parsed = *parsed + (int)name;
  plVar6 = lyd_node_module(node_00);
  uVar3 = (uint)*id;
  plVar22 = node_00;
  if (uVar3 == 0) goto LAB_00114643;
  pcVar11 = id;
  if ((node->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) {
LAB_00114ea3:
    uVar17 = (ulong)uVar3;
    ecode = LYE_PATH_INCHAR;
    elem_type = LY_VLOG_NONE;
    node = (lys_node *)0x0;
    goto LAB_00114eb3;
  }
  plVar19 = node_00->child;
  if (plVar19 == (lyd_node *)0x0) goto LAB_00114643;
  uVar3 = parse_schema_nodeid(id,&local_b8,&local_90,&mod_name,&local_8c,&local_54,&local_7c,
                              (int *)0x0,0);
  pcVar11 = (char *)CONCAT44(extraout_var_00,uVar3);
  if ((int)uVar3 < 1) goto LAB_00114f19;
  id = id + uVar3;
  local_48 = node_00;
  goto LAB_001146a2;
LAB_00114f19:
  pcVar11 = id + -uVar3;
  uVar17 = (ulong)(uint)(int)id[-uVar3];
LAB_00114f24:
  ecode = LYE_PATH_INCHAR;
  elem_type = LY_VLOG_NONE;
  node = (lys_node *)0x0;
LAB_00114eb3:
  ly_vlog(plStack_50,ecode,elem_type,node,uVar17,pcVar11);
  parsed = local_38;
  goto LAB_00114638;
}

Assistant:

struct lyd_node *
resolve_partial_json_data_nodeid(const char *nodeid, const char *llist_value, struct lyd_node *start, int options,
                                 int *parsed)
{
    const char *id, *mod_name, *name, *data_val, *llval;
    int r, ret, mod_name_len, nam_len, is_relative = -1, list_instance_position;
    int has_predicate, last_parsed = 0, llval_len;
    struct lyd_node *sibling, *last_match = NULL;
    struct lyd_node_leaf_list *llist;
    const struct lys_module *prev_mod;
    struct ly_ctx *ctx;
    const struct lys_node *ssibling, *sparent;
    struct lys_node_list *slist;
    struct parsed_pred pp;

    assert(nodeid && start && parsed);

    memset(&pp, 0, sizeof pp);
    ctx = start->schema->module->ctx;
    id = nodeid;

    /* parse first nodeid in case it is yang-data extension */
    if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, NULL, NULL, 1)) < 1) {
        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        goto error;
    }

    if (name[0] == '#') {
        if (is_relative) {
            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, '#', name);
            goto error;
        }
        id += r;
        last_parsed = r;
    } else {
        is_relative = -1;
    }

    /* parse first nodeid */
    if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate, NULL, 0)) < 1) {
        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        goto error;
    }
    id += r;
    /* add it to parsed only after the data node was actually found */
    last_parsed += r;

    if (is_relative) {
        prev_mod = lyd_node_module(start);
        start = (start->schema->nodetype & (LYS_CONTAINER | LYS_LIST | LYS_RPC | LYS_ACTION | LYS_NOTIF)) ? start->child : NULL;
    } else {
        for (; start->parent; start = start->parent);
        prev_mod = lyd_node_module(start);
    }
    if (!start) {
        /* there are no siblings to search */
        return NULL;
    }

    /* do not duplicate code, use predicate parsing from the loop */
    goto parse_predicates;

    while (1) {
        /* find the correct schema node first */
        ssibling = NULL;
        sparent = (start && start->parent) ? start->parent->schema : NULL;
        while ((ssibling = lys_getnext(ssibling, sparent, prev_mod, 0))) {
            /* skip invalid input/output nodes */
            if (sparent && (sparent->nodetype & (LYS_RPC | LYS_ACTION))) {
                if (options & LYD_PATH_OPT_OUTPUT) {
                    if (lys_parent(ssibling)->nodetype == LYS_INPUT) {
                        continue;
                    }
                } else {
                    if (lys_parent(ssibling)->nodetype == LYS_OUTPUT) {
                        continue;
                    }
                }
            }

            if (!schema_nodeid_siblingcheck(ssibling, prev_mod, mod_name, mod_name_len, name, nam_len)) {
                break;
            }
        }
        if (!ssibling) {
            /* there is not even such a schema node */
            free(pp.pred);
            return last_match;
        }
        pp.schema = ssibling;

        /* unify leaf-list value - it is possible to specify last-node value as both a predicate or parameter if
         * is a leaf-list, unify both cases and the value will in both cases be in the predicate structure */
        if (!id[0] && !pp.len && (ssibling->nodetype == LYS_LEAFLIST)) {
            pp.len = 1;
            pp.pred = calloc(1, sizeof *pp.pred);
            LY_CHECK_ERR_GOTO(!pp.pred, LOGMEM(ctx), error);

            pp.pred[0].name = ".";
            pp.pred[0].nam_len = 1;
            pp.pred[0].value = (llist_value ? llist_value : "");
            pp.pred[0].val_len = strlen(pp.pred[0].value);
        }

        if (ssibling->nodetype & (LYS_LEAFLIST | LYS_LEAF)) {
            /* check leaf/leaf-list predicate */
            if (pp.len > 1) {
                LOGVAL(ctx, LYE_PATH_PREDTOOMANY, LY_VLOG_NONE, NULL);
                goto error;
            } else if (pp.len) {
                if ((pp.pred[0].name[0] != '.') || (pp.pred[0].nam_len != 1)) {
                    LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, pp.pred[0].name[0], pp.pred[0].name);
                    goto error;
                }
                if ((((struct lys_node_leaf *)ssibling)->type.base == LY_TYPE_IDENT) && !strnchr(pp.pred[0].value, ':', pp.pred[0].val_len)) {
                    LOGVAL(ctx, LYE_PATH_INIDENTREF, LY_VLOG_LYS, ssibling, pp.pred[0].val_len, pp.pred[0].value);
                    goto error;
                }
            }
        } else if (ssibling->nodetype == LYS_LIST) {
            /* list should have predicates for all the keys or position */
            slist = (struct lys_node_list *)ssibling;
            if (!pp.len) {
                /* none match */
                return last_match;
            } else if (!isdigit(pp.pred[0].name[0])) {
                /* list predicate is not a position, so there must be all the keys */
                if (pp.len > slist->keys_size) {
                    LOGVAL(ctx, LYE_PATH_PREDTOOMANY, LY_VLOG_NONE, NULL);
                    goto error;
                } else if (pp.len < slist->keys_size) {
                    LOGVAL(ctx, LYE_PATH_MISSKEY, LY_VLOG_NONE, NULL, slist->keys[pp.len]->name);
                    goto error;
                }
                /* check that all identityrefs have module name, otherwise the hash of the list instance will never match!! */
                for (r = 0; r < pp.len; ++r) {
                    if ((slist->keys[r]->type.base == LY_TYPE_IDENT) && !strnchr(pp.pred[r].value, ':', pp.pred[r].val_len)) {
                        LOGVAL(ctx, LYE_PATH_INIDENTREF, LY_VLOG_LYS, slist->keys[r], pp.pred[r].val_len, pp.pred[r].value);
                        goto error;
                    }
                }
            }
        } else if (pp.pred) {
            /* no other nodes allow predicates */
            LOGVAL(ctx, LYE_PATH_PREDTOOMANY, LY_VLOG_NONE, NULL);
            goto error;
        }

#ifdef LY_ENABLED_CACHE
        /* we will not be matching keyless lists or state leaf-lists this way */
        if (start->parent && start->parent->ht && ((pp.schema->nodetype != LYS_LIST) || ((struct lys_node_list *)pp.schema)->keys_size)
                && ((pp.schema->nodetype != LYS_LEAFLIST) || (pp.schema->flags & LYS_CONFIG_W))) {
            sibling = resolve_json_data_node_hash(start->parent, pp);
        } else
#endif
        {
            list_instance_position = 0;
            LY_TREE_FOR(start, sibling) {
                /* RPC/action data check, return simply invalid argument, because the data tree is invalid */
                if (lys_parent(sibling->schema)) {
                    if (options & LYD_PATH_OPT_OUTPUT) {
                        if (lys_parent(sibling->schema)->nodetype == LYS_INPUT) {
                            LOGERR(ctx, LY_EINVAL, "Provided data tree includes some RPC input nodes (%s).", sibling->schema->name);
                            goto error;
                        }
                    } else {
                        if (lys_parent(sibling->schema)->nodetype == LYS_OUTPUT) {
                            LOGERR(ctx, LY_EINVAL, "Provided data tree includes some RPC output nodes (%s).", sibling->schema->name);
                            goto error;
                        }
                    }
                }

                if (sibling->schema != ssibling) {
                    /* wrong schema node */
                    continue;
                }

                /* leaf-list, did we find it with the correct value or not? */
                if (ssibling->nodetype == LYS_LEAFLIST) {
                    if (ssibling->flags & LYS_CONFIG_R) {
                        /* state leaf-lists will never match */
                        continue;
                    }

                    llist = (struct lyd_node_leaf_list *)sibling;

                    /* get the expected leaf-list value */
                    llval = NULL;
                    llval_len = 0;
                    if (pp.pred) {
                        /* it was already checked that it is correct */
                        llval = pp.pred[0].value;
                        llval_len = pp.pred[0].val_len;

                    }

                    /* make value canonical (remove module name prefix) unless it was specified with it */
                    if (llval && !strchr(llval, ':') && (llist->value_type & LY_TYPE_IDENT)
                            && !strncmp(llist->value_str, lyd_node_module(sibling)->name, strlen(lyd_node_module(sibling)->name))
                            && (llist->value_str[strlen(lyd_node_module(sibling)->name)] == ':')) {
                        data_val = llist->value_str + strlen(lyd_node_module(sibling)->name) + 1;
                    } else {
                        data_val = llist->value_str;
                    }

                    if ((!llval && data_val && data_val[0]) || (llval && (strncmp(llval, data_val, llval_len)
                            || data_val[llval_len]))) {
                        continue;
                    }

                } else if (ssibling->nodetype == LYS_LIST) {
                    /* list, we likely need predicates'n'stuff then, but if without a predicate, we are always creating it */
                    ++list_instance_position;
                    ret = resolve_partial_json_data_list_predicate(pp, sibling, list_instance_position);
                    if (ret == -1) {
                        goto error;
                    } else if (ret == 1) {
                        /* this list instance does not match */
                        continue;
                    }
                }

                break;
            }
        }

        /* no match, return last match */
        if (!sibling) {
            free(pp.pred);
            return last_match;
        }

        /* we found a next matching node */
        *parsed += last_parsed;
        last_match = sibling;
        prev_mod = lyd_node_module(sibling);

        /* the result node? */
        if (!id[0]) {
            free(pp.pred);
            return last_match;
        }

        /* move down the tree, if possible, and continue */
        if (ssibling->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
            /* there can be no children even through expected, error */
            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
            goto error;
        } else if (!sibling->child) {
            /* there could be some children, but are not, return what we found so far */
            free(pp.pred);
            return last_match;
        }
        start = sibling->child;

        /* parse nodeid */
        if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate, NULL, 0)) < 1) {
            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
            goto error;
        }
        id += r;
        last_parsed = r;

parse_predicates:
        /* parse all the predicates */
        free(pp.pred);
        pp.schema = NULL;
        pp.len = 0;
        pp.pred = NULL;
        while (has_predicate) {
            ++pp.len;
            pp.pred = ly_realloc(pp.pred, pp.len * sizeof *pp.pred);
            LY_CHECK_ERR_GOTO(!pp.pred, LOGMEM(ctx), error);
            if ((r = parse_schema_json_predicate(id, &pp.pred[pp.len - 1].mod_name, &pp.pred[pp.len - 1].mod_name_len,
                                                 &pp.pred[pp.len - 1].name, &pp.pred[pp.len - 1].nam_len, &pp.pred[pp.len - 1].value,
                                                 &pp.pred[pp.len - 1].val_len, &has_predicate)) < 1) {
                LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                goto error;
            }

            id += r;
            last_parsed += r;
        }
    }

error:
    *parsed = -1;
    free(pp.pred);
    return NULL;
}